

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_entityValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  long lVar5;
  
  pbVar3 = (byte *)ptr;
  if (ptr == end) {
    iVar2 = -4;
  }
  else {
    do {
      cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar3);
      switch(cVar1) {
      case '\x03':
        if (pbVar3 == (byte *)ptr) {
          iVar2 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
          return iVar2;
        }
        goto LAB_004da981;
      case '\x04':
      case '\b':
        goto switchD_004da952_caseD_4;
      case '\x05':
        lVar5 = 2;
        break;
      case '\x06':
        lVar5 = 3;
        break;
      case '\a':
        lVar5 = 4;
        break;
      case '\t':
        if (pbVar3 == (byte *)ptr) {
          if (ptr + 1 != end) {
            pcVar4 = ptr + 1;
            if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
              pcVar4 = ptr + 2;
            }
            *nextTokPtr = pcVar4;
            return 7;
          }
          return -3;
        }
        goto LAB_004da981;
      case '\n':
        if (pbVar3 == (byte *)ptr) {
          *nextTokPtr = ptr + 1;
          return 7;
        }
        goto LAB_004da981;
      default:
        if (cVar1 == '\x1e') {
          if (pbVar3 == (byte *)ptr) {
            iVar2 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
            if (iVar2 != 0x16) {
              return iVar2;
            }
            return 0;
          }
          goto LAB_004da981;
        }
switchD_004da952_caseD_4:
        lVar5 = 1;
      }
      pbVar3 = pbVar3 + lVar5;
    } while (pbVar3 != (byte *)end);
LAB_004da981:
    *nextTokPtr = (char *)pbVar3;
    iVar2 = 6;
  }
  return iVar2;
}

Assistant:

static
int PREFIX(entityValueTok)(const ENCODING *enc, const char *ptr, const char *end,
                           const char **nextTokPtr)
{
  const char *start;
  if (ptr == end)
    return XML_TOK_NONE;
  start = ptr;
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: ptr += n; break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_PERCNT:
      if (ptr == start) {
        int tok =  PREFIX(scanPercent)(enc, ptr + MINBPC(enc),
                                       end, nextTokPtr);
        return (tok == XML_TOK_PERCENT) ? XML_TOK_INVALID : tok;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}